

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O0

void deqp::gles3::Functional::eval_selection_uvec4(ShaderEvalContext *c)

{
  float fVar1;
  float *pfVar2;
  Vector<float,_4> local_70;
  Vector<float,_4> local_60;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  Functional local_30 [16];
  Vector<unsigned_int,_4> local_20;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  pfVar2 = tcu::Vector<float,_4>::z(c->in);
  fVar1 = *pfVar2;
  tcu::Vector<float,_4>::swizzle(&local_50,(int)local_10 + 0x40,3,2,1);
  tcu::Vector<float,_4>::asUint(&local_40);
  tcu::Vector<float,_4>::swizzle(&local_70,(int)local_10 + 0x50,0,3,2);
  tcu::Vector<float,_4>::asUint(&local_60);
  selection<tcu::Vector<unsigned_int,4>>
            (local_30,0.0 < fVar1,(Vector<unsigned_int,_4> *)&local_40,
             (Vector<unsigned_int,_4> *)&local_60);
  tcu::Vector<unsigned_int,_4>::asFloat(&local_20);
  *(undefined8 *)(local_10->color).m_data = local_20.m_data._0_8_;
  *(undefined8 *)((local_10->color).m_data + 2) = local_20.m_data._8_8_;
  return;
}

Assistant:

void eval_selection_uvec4	(ShaderEvalContext& c) { c.color		= selection(c.in[0].z() > 0.0f,			c.in[1].swizzle(3, 2, 1, 0).asUint(),	c.in[2].swizzle(0, 3, 2, 1).asUint()).asFloat(); }